

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O0

void Abc_NtkDelayOpt(Sfm_Dec_t *p)

{
  Abc_Ntk_t *pNtk_00;
  Sfm_Par_t *pPars_00;
  Abc_Ntk_t *pNtk_01;
  bool bVar1;
  int iVar2;
  uint Id;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint Id_00;
  Abc_Obj_t *pAVar7;
  abctime aVar8;
  abctime aVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  int local_7c;
  int i_1;
  int Var;
  int DelayOld;
  int OldId;
  int RetValue;
  int Limit;
  int i;
  abctime clk;
  Abc_Obj_t *pObjNew;
  Abc_Obj_t *pObj;
  int n;
  Sfm_Par_t *pPars;
  Abc_Ntk_t *pNtk;
  Sfm_Dec_t *p_local;
  
  pNtk_00 = p->pNtk;
  pPars_00 = p->pPars;
  Abc_NtkCleanMarkABC(pNtk_00);
  pObj._4_4_ = 0;
  while( true ) {
    bVar1 = true;
    if (pPars_00->nNodesMax != 0) {
      bVar1 = pObj._4_4_ < pPars_00->nNodesMax;
    }
    if (!bVar1) break;
    if (pPars_00->iNodeOne == 0) {
      if (((p->pTim != (Sfm_Tim_t *)0x0) &&
          (iVar2 = Sfm_TimPriorityNodes(p->pTim,&p->vCands,p->pPars->nTimeWin), iVar2 == 0)) ||
         ((p->pMit != (Sfm_Mit_t *)0x0 &&
          (iVar2 = Sfm_MitPriorityNodes(p->pMit,&p->vCands,p->pPars->nTimeWin), iVar2 == 0))))
      break;
    }
    else {
      Vec_IntFill(&p->vCands,1,pPars_00->iNodeOne);
    }
    for (RetValue = 0; iVar2 = Vec_IntSize(&p->vCands), RetValue < iVar2; RetValue = RetValue + 1) {
      pNtk_01 = p->pNtk;
      iVar2 = Vec_IntEntry(&p->vCands,RetValue);
      pAVar7 = Abc_NtkObj(pNtk_01,iVar2);
      if (pAVar7 != (Abc_Obj_t *)0x0) {
        Id = Abc_ObjId(pAVar7);
        iVar2 = Sfm_ManReadObjDelay(p,Id);
        if ((*(uint *)&pAVar7->field_0x14 >> 4 & 1) != 0) {
          __assert_fail("pObj->fMarkA == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                        ,0x7d5,"void Abc_NtkDelayOpt(Sfm_Dec_t *)");
        }
        p->nNodesTried = p->nNodesTried + 1;
        aVar8 = Abc_Clock();
        iVar3 = Sfm_DecExtract(pNtk_00,pPars_00,pAVar7,&p->vObjRoots,&p->vObjGates,&p->vObjFanins,
                               &p->vObjMap,&p->vGateTfi,&p->vGateTfo,&p->vObjMffc,&p->vObjInMffc,
                               p->pTim,p->pMit);
        p->nDivs = iVar3;
        aVar9 = Abc_Clock();
        p->timeWin = (aVar9 - aVar8) + p->timeWin;
        if ((p->nDivs < 2) ||
           ((pPars_00->nWinSizeMax != 0 &&
            (iVar3 = pPars_00->nWinSizeMax, iVar4 = Vec_IntSize(&p->vObjGates), iVar3 < iVar4)))) {
          *(uint *)&pAVar7->field_0x14 = *(uint *)&pAVar7->field_0x14 & 0xffffffef | 0x10;
        }
        else {
          iVar3 = Vec_IntSize(&p->vObjMffc);
          p->nMffc = iVar3;
          iVar3 = Sfm_DecMffcArea(pNtk_00,&p->vObjMffc);
          p->AreaMffc = iVar3;
          iVar3 = Abc_MaxInt(p->nMaxDivs,p->nDivs);
          p->nMaxDivs = iVar3;
          p->nAllDivs = (long)p->nDivs + p->nAllDivs;
          p->iTarget = (pAVar7->field_6).iTemp;
          iVar3 = Vec_IntSize(&p->vObjGates);
          iVar4 = Abc_MaxInt(p->nMaxWin,iVar3);
          p->nMaxWin = iVar4;
          p->nAllWin = (long)iVar3 + p->nAllWin;
          aVar8 = Abc_Clock();
          iVar4 = Sfm_DecPrepareSolver(p);
          aVar9 = Abc_Clock();
          p->timeCnf = (aVar9 - aVar8) + p->timeCnf;
          if (iVar4 == 0) {
            *(uint *)&pAVar7->field_0x14 = *(uint *)&pAVar7->field_0x14 & 0xffffffef | 0x10;
          }
          else {
            aVar8 = Abc_Clock();
            DelayOld = Sfm_DecPeformDec3(p,pAVar7);
            if ((pPars_00->fMoreEffort != 0) && (DelayOld < 0)) {
              local_7c = Vec_IntSize(&p->vObjInMffc);
              do {
                local_7c = local_7c + -1;
                if (local_7c < 0) goto LAB_0065b725;
                iVar4 = Vec_IntEntry(&p->vObjInMffc,local_7c);
                p->iUseThis = iVar4;
                DelayOld = Sfm_DecPeformDec3(p,pAVar7);
                p->iUseThis = -1;
              } while (DelayOld < 0);
              p->nEfforts = p->nEfforts + 1;
            }
LAB_0065b725:
            if (p->pPars->fVeryVerbose != 0) {
              printf("\n\n");
            }
            aVar9 = Abc_Clock();
            p->timeSat = (aVar9 - aVar8) + p->timeSat;
            if (-1 < DelayOld) {
              iVar4 = Vec_IntSize(&p->vObjGates);
              if (iVar4 - iVar3 < 1) {
                __assert_fail("Vec_IntSize(&p->vObjGates) - Limit > 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                              ,0x811,"void Abc_NtkDelayOpt(Sfm_Dec_t *)");
              }
              iVar4 = Vec_IntSize(&p->vObjGates);
              if (2 < iVar4 - iVar3) {
                __assert_fail("Vec_IntSize(&p->vObjGates) - Limit <= 2",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                              ,0x812,"void Abc_NtkDelayOpt(Sfm_Dec_t *)");
              }
              p->nNodesChanged = p->nNodesChanged + 1;
              Abc_NtkCountStats(p,iVar3);
              if (p->pMit != (Sfm_Mit_t *)0x0) {
                Sfm_MitUpdateLoad(p->pMit,&p->vGateMffc,0);
              }
              Sfm_DecInsert(pNtk_00,pAVar7,iVar3,&p->vObjGates,&p->vObjFanins,&p->vObjMap,
                            &p->vGateHands,p->GateBuffer,p->GateInvert,&p->vGateFuncs,&p->vNewNodes,
                            p->pMit);
              if (p->pMit != (Sfm_Mit_t *)0x0) {
                Sfm_MitUpdateLoad(p->pMit,&p->vNewNodes,1);
              }
              aVar8 = Abc_Clock();
              if (p->pMit == (Sfm_Mit_t *)0x0) {
                Sfm_TimUpdateTiming(p->pTim,&p->vNewNodes);
              }
              else {
                Sfm_MitUpdateTiming(p->pMit,&p->vNewNodes);
              }
              aVar9 = Abc_Clock();
              p->timeTime = (aVar9 - aVar8) + p->timeTime;
              iVar3 = Abc_NtkObjNumMax(pNtk_00);
              pAVar7 = Abc_NtkObj(pNtk_00,iVar3 + -1);
              if ((p->pMit == (Sfm_Mit_t *)0x0) && (p->DelayMin != 0)) {
                iVar3 = p->DelayMin;
                uVar5 = Abc_ObjId(pAVar7);
                iVar4 = Sfm_ManReadObjDelay(p,uVar5);
                if (iVar3 != iVar4) {
                  __assert_fail("p->pMit || p->DelayMin == 0 || p->DelayMin == Sfm_ManReadObjDelay(p, Abc_ObjId(pObjNew))"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                                ,0x821,"void Abc_NtkDelayOpt(Sfm_Dec_t *)");
                }
              }
              if (pPars_00->fDelayVerbose != 0) {
                uVar5 = Abc_NtkObjNumMax(p->pNtk);
                uVar6 = Vec_IntSize(&p->vCands);
                iVar3 = Vec_IntSize(&p->vCands);
                iVar4 = Abc_NtkNodeNum(p->pNtk);
                fVar10 = Scl_Int2Flt(iVar2);
                Id_00 = Abc_ObjId(pAVar7);
                iVar2 = Sfm_ManReadObjDelay(p,Id_00);
                fVar11 = Scl_Int2Flt(iVar2);
                iVar2 = Sfm_ManReadNtkDelay(p);
                fVar12 = Scl_Int2Flt(iVar2);
                iVar2 = Sfm_ManReadNtkMinSlack(p);
                fVar13 = Scl_Int2Flt(iVar2);
                printf("Node %5d  %5d :  I =%3d.  Cand = %5d (%6.2f %%)   Old =%8.2f.  New =%8.2f.  Final =%8.2f.  WNS =%8.2f.\n"
                       ,((double)iVar3 * 100.0) / (double)iVar4,(double)fVar10,(double)fVar11,
                       (double)fVar12,(double)fVar13,(ulong)Id,(ulong)uVar5,(ulong)(uint)RetValue,
                       (ulong)uVar6);
              }
              break;
            }
            *(uint *)&pAVar7->field_0x14 = *(uint *)&pAVar7->field_0x14 & 0xffffffef | 0x10;
          }
        }
      }
    }
    if (pPars_00->iNodeOne != 0) break;
    pObj._4_4_ = pObj._4_4_ + 1;
  }
  Abc_NtkCleanMarkABC(pNtk_00);
  return;
}

Assistant:

void Abc_NtkDelayOpt( Sfm_Dec_t * p )
{
    Abc_Ntk_t * pNtk = p->pNtk;
    Sfm_Par_t * pPars = p->pPars; int n;
    Abc_NtkCleanMarkABC( pNtk );
    for ( n = 0; pPars->nNodesMax == 0 || n < pPars->nNodesMax; n++ )
    {
        Abc_Obj_t * pObj, * pObjNew; abctime clk;
        int i = 0, Limit, RetValue;
        // collect nodes
        if ( pPars->iNodeOne )
            Vec_IntFill( &p->vCands, 1, pPars->iNodeOne );
        else if ( p->pTim && !Sfm_TimPriorityNodes(p->pTim, &p->vCands, p->pPars->nTimeWin) )
            break;
        else if ( p->pMit && !Sfm_MitPriorityNodes(p->pMit, &p->vCands, p->pPars->nTimeWin) )
            break;
        // try improving delay for the nodes according to the priority
        Abc_NtkForEachObjVec( &p->vCands, p->pNtk, pObj, i )
        {
            int OldId = Abc_ObjId(pObj);
            int DelayOld = Sfm_ManReadObjDelay(p, OldId);
            assert( pObj->fMarkA == 0 );
            p->nNodesTried++;
clk = Abc_Clock();
            p->nDivs = Sfm_DecExtract( pNtk, pPars, pObj, &p->vObjRoots, &p->vObjGates, &p->vObjFanins, &p->vObjMap, &p->vGateTfi, &p->vGateTfo, &p->vObjMffc, &p->vObjInMffc, p->pTim, p->pMit );
p->timeWin += Abc_Clock() - clk;
            if ( p->nDivs < 2 || (pPars->nWinSizeMax && pPars->nWinSizeMax < Vec_IntSize(&p->vObjGates)) )
            { 
                pObj->fMarkA = 1;
                continue;
            }
            p->nMffc = Vec_IntSize(&p->vObjMffc);
            p->AreaMffc = Sfm_DecMffcArea(pNtk, &p->vObjMffc);
            p->nMaxDivs = Abc_MaxInt( p->nMaxDivs, p->nDivs );
            p->nAllDivs += p->nDivs;
            p->iTarget = pObj->iTemp;
            Limit = Vec_IntSize( &p->vObjGates );
            p->nMaxWin = Abc_MaxInt( p->nMaxWin, Limit );
            p->nAllWin += Limit;
clk = Abc_Clock();
            RetValue = Sfm_DecPrepareSolver( p );
p->timeCnf += Abc_Clock() - clk;
            if ( !RetValue )
            {
                pObj->fMarkA = 1;
                continue;
            }
clk = Abc_Clock();
            RetValue = Sfm_DecPeformDec3( p, pObj );
            if ( pPars->fMoreEffort && RetValue < 0 )
            {
                int Var, i;
                Vec_IntForEachEntryReverse( &p->vObjInMffc, Var, i )
                {
                    p->iUseThis = Var; 
                    RetValue = Sfm_DecPeformDec3( p, pObj );
                    p->iUseThis = -1;
                    if ( RetValue < 0 )
                    {
                        //printf( "Node %d: Not found among %d.\n", Abc_ObjId(pObj), Vec_IntSize(&p->vObjInMffc) );
                    }
                    else
                    {
                        p->nEfforts++;
                        if ( p->pPars->fVerbose )
                        {
                            //printf( "Node %5d: (%2d out of %2d)  Gate=%s ", Abc_ObjId(pObj), i, Vec_IntSize(&p->vObjInMffc), Mio_GateReadName((Mio_Gate_t*)pObj->pData) );
                            //Dau_DsdPrintFromTruth( p->Copy, p->nSuppVars );
                        }
                        break;
                    }
                }
            }
            if ( p->pPars->fVeryVerbose )
                printf( "\n\n" );
p->timeSat += Abc_Clock() - clk;
            if ( RetValue < 0 )
            {
                pObj->fMarkA = 1;
                continue;
            }
            assert( Vec_IntSize(&p->vObjGates) - Limit > 0 );
            assert( Vec_IntSize(&p->vObjGates) - Limit <= 2 );
            p->nNodesChanged++;
            Abc_NtkCountStats( p, Limit );
            // reduce load due to removed MFFC
            if ( p->pMit ) Sfm_MitUpdateLoad( p->pMit, &p->vGateMffc, 0 ); // assuming &p->vGateMffc contains MFFC
            Sfm_DecInsert( pNtk, pObj, Limit, &p->vObjGates, &p->vObjFanins, &p->vObjMap, &p->vGateHands, p->GateBuffer, p->GateInvert, &p->vGateFuncs, &p->vNewNodes, p->pMit );
            // increase load due to added new nodes
            if ( p->pMit ) Sfm_MitUpdateLoad( p->pMit, &p->vNewNodes, 1 ); // assuming &p->vNewNodes contains new nodes
clk = Abc_Clock();
            if ( p->pMit )
                Sfm_MitUpdateTiming( p->pMit, &p->vNewNodes );
            else
                Sfm_TimUpdateTiming( p->pTim, &p->vNewNodes );
p->timeTime += Abc_Clock() - clk;
            pObjNew = Abc_NtkObj( pNtk, Abc_NtkObjNumMax(pNtk)-1 );
            assert( p->pMit || p->DelayMin == 0 || p->DelayMin == Sfm_ManReadObjDelay(p, Abc_ObjId(pObjNew)) );
            // report
            if ( pPars->fDelayVerbose )
                printf( "Node %5d  %5d :  I =%3d.  Cand = %5d (%6.2f %%)   Old =%8.2f.  New =%8.2f.  Final =%8.2f.  WNS =%8.2f.\n", 
                    OldId, Abc_NtkObjNumMax(p->pNtk), i, Vec_IntSize(&p->vCands), 100.0 * Vec_IntSize(&p->vCands) / Abc_NtkNodeNum(p->pNtk),
                    Scl_Int2Flt(DelayOld), Scl_Int2Flt(Sfm_ManReadObjDelay(p, Abc_ObjId(pObjNew))), 
                    Scl_Int2Flt(Sfm_ManReadNtkDelay(p)), Scl_Int2Flt(Sfm_ManReadNtkMinSlack(p)) );
            break;
        }
        if ( pPars->iNodeOne )
            break;
    }
    Abc_NtkCleanMarkABC( pNtk );
}